

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O2

void Sto_ManMemoryStop(Sto_Man_t *p)

{
  char *pcVar1;
  char *__ptr;
  
  __ptr = p->pChunkLast;
  while (__ptr != (char *)0x0) {
    pcVar1 = *(char **)__ptr;
    free(__ptr);
    __ptr = pcVar1;
  }
  return;
}

Assistant:

void Sto_ManMemoryStop( Sto_Man_t * p )
{
    char * pMem, * pNext;
    if ( p->pChunkLast == NULL )
        return;
    for ( pMem = p->pChunkLast; (pNext = *(char **)pMem); pMem = pNext )
        ABC_FREE( pMem );
    ABC_FREE( pMem );
}